

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O0

int x25519_auth_decap(EVP_HPKE_KEY *key,uint8_t *out_shared_secret,size_t *out_shared_secret_len,
                     uint8_t *enc,size_t enc_len,uint8_t *peer_public_key,size_t peer_public_key_len
                     )

{
  uint16_t kem_id;
  int iVar1;
  EVP_MD *hkdf_md;
  uint8_t local_e8 [8];
  uint8_t kem_context [96];
  uint8_t dh [64];
  uint8_t *peer_public_key_local;
  size_t enc_len_local;
  uint8_t *enc_local;
  size_t *out_shared_secret_len_local;
  uint8_t *out_shared_secret_local;
  EVP_HPKE_KEY *key_local;
  
  if ((((enc_len == 0x20) && (peer_public_key_len == 0x20)) &&
      (iVar1 = X25519(kem_context + 0x58,key->private_key,enc), iVar1 != 0)) &&
     (iVar1 = X25519(dh + 0x18,key->private_key,peer_public_key), iVar1 != 0)) {
    OPENSSL_memcpy(local_e8,enc,0x20);
    OPENSSL_memcpy(kem_context + 0x18,key->public_key,0x20);
    OPENSSL_memcpy(kem_context + 0x38,peer_public_key,0x20);
    kem_id = key->kem->id;
    hkdf_md = EVP_sha256();
    iVar1 = dhkem_extract_and_expand
                      (kem_id,(EVP_MD *)hkdf_md,out_shared_secret,0x20,kem_context + 0x58,0x40,
                       local_e8,0x60);
    if (iVar1 == 0) {
      return 0;
    }
    *out_shared_secret_len = 0x20;
    return 1;
  }
  ERR_put_error(6,0,0x86,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                ,0x117);
  return 0;
}

Assistant:

static int x25519_auth_decap(const EVP_HPKE_KEY *key,
                             uint8_t *out_shared_secret,
                             size_t *out_shared_secret_len, const uint8_t *enc,
                             size_t enc_len, const uint8_t *peer_public_key,
                             size_t peer_public_key_len) {
  uint8_t dh[2 * X25519_SHARED_KEY_LEN];
  if (enc_len != X25519_PUBLIC_VALUE_LEN ||
      peer_public_key_len != X25519_PUBLIC_VALUE_LEN ||
      !X25519(dh, key->private_key, enc) ||
      !X25519(dh + X25519_SHARED_KEY_LEN, key->private_key, peer_public_key)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PEER_KEY);
    return 0;
  }

  uint8_t kem_context[3 * X25519_PUBLIC_VALUE_LEN];
  OPENSSL_memcpy(kem_context, enc, X25519_PUBLIC_VALUE_LEN);
  OPENSSL_memcpy(kem_context + X25519_PUBLIC_VALUE_LEN, key->public_key,
                 X25519_PUBLIC_VALUE_LEN);
  OPENSSL_memcpy(kem_context + 2 * X25519_PUBLIC_VALUE_LEN, peer_public_key,
                 X25519_PUBLIC_VALUE_LEN);
  if (!dhkem_extract_and_expand(key->kem->id, EVP_sha256(), out_shared_secret,
                                SHA256_DIGEST_LENGTH, dh, sizeof(dh),
                                kem_context, sizeof(kem_context))) {
    return 0;
  }

  *out_shared_secret_len = SHA256_DIGEST_LENGTH;
  return 1;
}